

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O1

void __thiscall
covenant::CycleBreaking<covenant::Sym>::cycle_breaking_transf_rule
          (CycleBreaking<covenant::Sym> *this,CFG *g,int lhs,
          vector<covenant::Sym,_std::allocator<covenant::Sym>_> *rule,
          unordered_map<int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_covenant::Sym>_>_>
          *new_non_terminals,set<int,_std::less<int>,_std::allocator<int>_> *group_set)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  emplace_return eVar6;
  int curr_nt;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> terminal_symbols;
  Rule new_rr;
  Rule new_r;
  int local_ec;
  Sym local_e8;
  int local_e4;
  CFG *local_e0;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_d8;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
  *local_b8;
  undefined1 local_b0 [16];
  pointer local_a0;
  iterator iStack_98;
  Sym *local_90;
  undefined1 local_88 [16];
  pointer local_78;
  iterator iStack_70;
  Sym *local_68;
  CycleBreaking<covenant::Sym> *local_60;
  set<int,_std::less<int>,_std::allocator<int>_> *local_58;
  element_type *local_50;
  shared_count local_48;
  element_type *local_40;
  shared_count local_38;
  
  local_ec = 0;
  local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e4 = lhs;
  local_b8 = &new_non_terminals->table_;
  local_60 = this;
  local_58 = group_set;
  bVar2 = findNextNonTerminal(this,rule,group_set,&local_d8,&local_ec);
  local_88._0_8_ = (g->_tfac).px;
  local_88._8_8_ = (g->_tfac).pn.pi_;
  if ((sp_counted_base *)local_88._8_8_ != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_88._8_8_)->use_count_ =
         ((sp_counted_base *)local_88._8_8_)->use_count_ + 1;
    UNLOCK();
  }
  if ((sp_counted_base *)local_88._8_8_ != (sp_counted_base *)0x0) {
    LOCK();
    ((sp_counted_base *)local_88._8_8_)->use_count_ =
         ((sp_counted_base *)local_88._8_8_)->use_count_ + 1;
    UNLOCK();
  }
  local_78 = (pointer)0x0;
  iStack_70._M_current = (Sym *)0x0;
  local_68 = (Sym *)0x0;
  local_e0 = g;
  local_40 = (element_type *)local_88._0_8_;
  local_38.pi_ = (sp_counted_base *)local_88._8_8_;
  boost::detail::shared_count::~shared_count(&local_38);
  if (local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      local_b0._0_4_ =
           local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3].x;
      if (iStack_70._M_current == local_68) {
        std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
        _M_realloc_insert<covenant::Sym_const&>
                  ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_78,iStack_70,
                   (Sym *)local_b0);
      }
      else {
        (iStack_70._M_current)->x =
             local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3].x;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      bVar1 = uVar4 < (ulong)((long)local_d8.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_d8.
                                    super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  if (bVar2) {
    eVar6 = boost::unordered::detail::
            table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
            ::try_emplace_unique<int_const&>
                      ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                        *)local_b8,&local_e4);
    iVar5 = *(int *)((long)&((eVar6.first.node_.node_)->value_base_).data_.data_ + 4);
    local_b0._0_4_ = iVar5;
    if (iStack_70._M_current == local_68) {
      std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
      _M_realloc_insert<covenant::Sym_const&>
                ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_78,iStack_70,
                 (Sym *)local_b0);
    }
    else {
      (iStack_70._M_current)->x = iVar5;
      iStack_70._M_current = iStack_70._M_current + 1;
    }
    CFG::prod(local_e0,(Sym)(local_e4 * 2 + 1),(Rule *)local_88);
  }
  else {
    iVar5 = (rule->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>)._M_impl.
            super__Vector_impl_data._M_start[local_ec].x;
    local_b0._0_4_ = iVar5;
    if (iStack_70._M_current == local_68) {
      std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
      _M_realloc_insert<covenant::Sym_const&>
                ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_78,iStack_70,
                 (Sym *)local_b0);
    }
    else {
      (iStack_70._M_current)->x = iVar5;
      iStack_70._M_current = iStack_70._M_current + 1;
    }
    CFG::prod(local_e0,(Sym)(local_e4 * 2 + 1),(Rule *)local_88);
    iVar5 = local_ec;
    local_ec = local_ec + 1;
    do {
      if (bVar2 != false) break;
      if (local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      bVar2 = findNextNonTerminal(local_60,rule,local_58,&local_d8,&local_ec);
      local_b0._0_8_ = (local_e0->_tfac).px;
      local_b0._8_8_ = (local_e0->_tfac).pn.pi_;
      if ((sp_counted_base *)local_b0._8_8_ != (sp_counted_base *)0x0) {
        LOCK();
        ((sp_counted_base *)local_b0._8_8_)->use_count_ =
             ((sp_counted_base *)local_b0._8_8_)->use_count_ + 1;
        UNLOCK();
        LOCK();
        ((sp_counted_base *)local_b0._8_8_)->use_count_ =
             ((sp_counted_base *)local_b0._8_8_)->use_count_ + 1;
        UNLOCK();
      }
      local_a0 = (pointer)0x0;
      iStack_98._M_current = (Sym *)0x0;
      local_90 = (Sym *)0x0;
      local_50 = (element_type *)local_b0._0_8_;
      local_48.pi_ = (sp_counted_base *)local_b0._8_8_;
      boost::detail::shared_count::~shared_count(&local_48);
      if (local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar3 = 0;
        uVar4 = 1;
        do {
          local_e8.x = local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar3].x;
          if (iStack_98._M_current == local_90) {
            std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
            _M_realloc_insert<covenant::Sym_const&>
                      ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_a0,iStack_98,
                       &local_e8);
          }
          else {
            (iStack_98._M_current)->x = local_e8.x;
            iStack_98._M_current = iStack_98._M_current + 1;
          }
          bVar1 = uVar4 < (ulong)((long)local_d8.
                                        super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_d8.
                                        super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2);
          uVar3 = uVar4;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (bVar1);
      }
      if (bVar2) {
        eVar6 = boost::unordered::detail::
                table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                ::try_emplace_unique<int_const&>
                          ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,covenant::Sym>>,int,covenant::Sym,boost::hash<int>,std::equal_to<int>>>
                            *)local_b8,&local_e4);
        local_e8.x = *(int *)((long)&((eVar6.first.node_.node_)->value_base_).data_.data_ + 4);
        if (iStack_98._M_current == local_90) {
          std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
          _M_realloc_insert<covenant::Sym_const&>
                    ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_a0,iStack_98,
                     &local_e8);
        }
        else {
          (iStack_98._M_current)->x = local_e8.x;
          iStack_98._M_current = iStack_98._M_current + 1;
        }
        local_e8.x = (rule->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                     _M_impl.super__Vector_impl_data._M_start[iVar5].x >> 1;
        eVar6 = boost::unordered::detail::
                table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
                ::try_emplace_unique<int>(local_b8,&local_e8.x);
        CFG::prod(local_e0,(Sym)*(int *)((long)&((eVar6.first.node_.node_)->value_base_).data_.data_
                                        + 4),(Rule *)local_b0);
      }
      else {
        local_e8.x = (rule->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                     _M_impl.super__Vector_impl_data._M_start[local_ec].x;
        if (iStack_98._M_current == local_90) {
          std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
          _M_realloc_insert<covenant::Sym_const&>
                    ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_a0,iStack_98,
                     &local_e8);
        }
        else {
          (iStack_98._M_current)->x = local_e8.x;
          iStack_98._M_current = iStack_98._M_current + 1;
        }
        local_e8.x = (rule->super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>).
                     _M_impl.super__Vector_impl_data._M_start[iVar5].x >> 1;
        eVar6 = boost::unordered::detail::
                table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_covenant::Sym>_>,_int,_covenant::Sym,_boost::hash<int>,_std::equal_to<int>_>_>
                ::try_emplace_unique<int>(local_b8,&local_e8.x);
        CFG::prod(local_e0,(Sym)*(int *)((long)&((eVar6.first.node_.node_)->value_base_).data_.data_
                                        + 4),(Rule *)local_b0);
        iVar5 = local_ec;
        local_ec = local_ec + 1;
      }
      if (local_a0 != (pointer)0x0) {
        operator_delete(local_a0);
      }
      boost::detail::shared_count::~shared_count((shared_count *)(local_b0 + 8));
    } while (!bVar2);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78);
  }
  boost::detail::shared_count::~shared_count((shared_count *)(local_88 + 8));
  if (local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cycle_breaking_transf_rule (CFG &g, 
                                   const int lhs, 
                                   const vector<EdgeSym> rule, 
                                   boost::unordered_map<int, EdgeSym> new_non_terminals,
                                   const set<int> group_set)
  {
    int curr_nt=0;
    vector<EdgeSym> terminal_symbols;
    bool finished = findNextNonTerminal (rule, group_set, 
                                         terminal_symbols, curr_nt);
    Rule new_r (g.getTermFactory ());
    for(unsigned i=0; i< terminal_symbols.size(); i++)
      new_r << terminal_symbols[i];
      
    if (finished)
    {
      // the rule has only terminal symbols
      new_r << new_non_terminals[lhs];
      g.prod(EdgeSym::mkVar(lhs), new_r);

      // LOG ("abstraction", 
      //      cout << "\t\trule only with terminal symbols: ";
      //      g.printProduction(cout, lhs); cout << endl);

      return;
    }
    else
    {
      // we found the first nonterminal symbol
      new_r << rule[curr_nt];
      g.prod(EdgeSym::mkVar(lhs), new_r);	

      // LOG ("abstraction" , 
      //      cout << "\t\tAdded rule from first nonterminal: ";
      //      g.printProduction(cout, lhs); cout << endl);

    }
    int prev_nt = curr_nt;
    curr_nt++;
    while (!finished)
    {
      terminal_symbols.clear();
      finished = findNextNonTerminal(rule, group_set, 
                                     terminal_symbols, curr_nt);
      Rule new_rr (g.getTermFactory ());
      for(unsigned i=0; i< terminal_symbols.size(); i++)
        new_rr << terminal_symbols[i];
      if (!finished)
      {
        // intermediate non terminal symbol
        new_rr << rule[curr_nt];
        g.prod(new_non_terminals[rule[prev_nt].symID ()], new_rr);

        // LOG ("abstraction", 
        //      cout << "\t\tintermediate nonterminal symbol: ";
        //      g.printProduction(cout, 
        //                        symID(new_non_terminals[symID(rule[prev_nt])]));
        //      cout << endl);

        prev_nt = curr_nt;
        curr_nt++;
      }
      else
      {
        // last non terminal symbol
        new_rr << new_non_terminals[lhs];
        g.prod(new_non_terminals[rule[prev_nt].symID ()], new_rr);

        // LOG ("abstraction", 
        //      cout << "\t\tlast nonterminal symbol: ";
        //      g.printProduction(cout, 
        //                        symID(new_non_terminals[symID(rule[prev_nt])]));
        //      cout << endl);

        break;
      }
    }
  }